

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cc
# Opt level: O3

void Minisat::printUsageAndExit(int param_1,char **argv,bool verbose)

{
  char *pcVar1;
  vec<Minisat::Option_*,_int> *pvVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  
  if (Option::getUsageString()::usage_str != (char *)0x0) {
    fprintf(_stderr,Option::getUsageString()::usage_str,*argv);
  }
  pvVar2 = Option::getOptionList();
  sort<Minisat::Option*,Minisat::Option::OptionLt>(pvVar2->data,pvVar2->sz);
  pvVar2 = Option::getOptionList();
  if (0 < pvVar2->sz) {
    lVar4 = 0;
    pcVar3 = (char *)0x0;
    pcVar5 = (char *)0x0;
    do {
      pvVar2 = Option::getOptionList();
      pcVar1 = pvVar2->data[lVar4]->category;
      pvVar2 = Option::getOptionList();
      if (pcVar1 == pcVar3) {
        if (pvVar2->data[lVar4]->type_name != pcVar5) {
          fputc(10,_stderr);
        }
      }
      else {
        fprintf(_stderr,"\n%s OPTIONS:\n\n",pcVar1);
      }
      pvVar2 = Option::getOptionList();
      (*pvVar2->data[lVar4]->_vptr_Option[3])(pvVar2->data[lVar4],(ulong)verbose);
      pvVar2 = Option::getOptionList();
      pcVar3 = pvVar2->data[lVar4]->category;
      pvVar2 = Option::getOptionList();
      pcVar5 = pvVar2->data[lVar4]->type_name;
      lVar4 = lVar4 + 1;
      pvVar2 = Option::getOptionList();
    } while (lVar4 < pvVar2->sz);
  }
  fwrite("\nHELP OPTIONS:\n\n",0x10,1,_stderr);
  fprintf(_stderr,"  --%shelp        Print help message.\n",
          Option::getHelpPrefixString()::help_prefix_str);
  fprintf(_stderr,"  --%shelp-verb   Print verbose help message.\n",
          Option::getHelpPrefixString()::help_prefix_str);
  fputc(10,_stderr);
  exit(0);
}

Assistant:

void Minisat::printUsageAndExit (int /*argc*/, char** argv, bool verbose)
{
    const char* usage = Option::getUsageString();
    if (usage != NULL)
        fprintf(stderr, usage, argv[0]);

    sort(Option::getOptionList(), Option::OptionLt());

    const char* prev_cat  = NULL;
    const char* prev_type = NULL;

    for (int i = 0; i < Option::getOptionList().size(); i++){
        const char* cat  = Option::getOptionList()[i]->category;
        const char* type = Option::getOptionList()[i]->type_name;

        if (cat != prev_cat)
            fprintf(stderr, "\n%s OPTIONS:\n\n", cat);
        else if (type != prev_type)
            fprintf(stderr, "\n");

        Option::getOptionList()[i]->help(verbose);

        prev_cat  = Option::getOptionList()[i]->category;
        prev_type = Option::getOptionList()[i]->type_name;
    }

    fprintf(stderr, "\nHELP OPTIONS:\n\n");
    fprintf(stderr, "  --%shelp        Print help message.\n", Option::getHelpPrefixString());
    fprintf(stderr, "  --%shelp-verb   Print verbose help message.\n", Option::getHelpPrefixString());
    fprintf(stderr, "\n");
    exit(0);
}